

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

SharedPtr<vkt::Draw::Buffer> __thiscall
vkt::QueryPool::anon_unknown_0::GraphicBasicTestInstance::creatAndFillVertexBuffer
          (GraphicBasicTestInstance *this)

{
  ulong uVar1;
  VkDeviceSize VVar2;
  _func_int *p_Var3;
  void *__dest;
  void *__src;
  DeviceInterface *vk;
  VkDevice device;
  VkPhysicalDeviceProperties *pVVar4;
  Allocator *allocator;
  SharedPtrStateBase *extraout_RDX;
  long in_RSI;
  ulong uVar5;
  SharedPtr<vkt::Draw::Buffer> SVar6;
  Allocation local_a0;
  BufferCreateInfo local_80;
  
  vk = Context::getDeviceInterface(*(Context **)(in_RSI + 8));
  device = Context::getDevice(*(Context **)(in_RSI + 8));
  uVar5 = **(ulong **)(in_RSI + 0xf8);
  uVar1 = (*(ulong **)(in_RSI + 0xf8))[1];
  pVVar4 = Context::getDeviceProperties(*(Context **)(in_RSI + 8));
  VVar2 = (pVVar4->limits).nonCoherentAtomSize;
  uVar5 = -VVar2 & ~uVar5 + uVar1 + VVar2;
  Draw::BufferCreateInfo::BufferCreateInfo
            (&local_80,uVar5,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  allocator = Context::getDefaultAllocator(*(Context **)(in_RSI + 8));
  Draw::Buffer::createAndAlloc
            ((Buffer *)this,vk,device,&local_80.super_VkBufferCreateInfo,allocator,
             (MemoryRequirement)0x1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&local_80.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  p_Var3 = *(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance;
  local_80.super_VkBufferCreateInfo._0_8_ = &PTR__Allocation_00bf5e28;
  __dest = *(void **)(p_Var3 + 0x18);
  local_80.super_VkBufferCreateInfo.pNext = *(void **)(p_Var3 + 8);
  local_80.super_VkBufferCreateInfo._16_8_ = *(undefined8 *)(p_Var3 + 0x10);
  local_80.super_VkBufferCreateInfo.size = (VkDeviceSize)__dest;
  ::vk::Allocation::~Allocation((Allocation *)&local_80);
  __src = (void *)**(undefined8 **)(in_RSI + 0xf8);
  memcpy(__dest,__src,(*(undefined8 **)(in_RSI + 0xf8))[1] - (long)__src);
  p_Var3 = *(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance;
  local_80.super_VkBufferCreateInfo._0_8_ = &PTR__Allocation_00bf5e28;
  local_80.super_VkBufferCreateInfo.pNext = *(void **)(p_Var3 + 8);
  local_80.super_VkBufferCreateInfo._16_8_ = *(undefined8 *)(p_Var3 + 0x10);
  local_80.super_VkBufferCreateInfo.size = *(VkDeviceSize *)(p_Var3 + 0x18);
  local_a0._vptr_Allocation = (_func_int **)&PTR__Allocation_00bf5e28;
  local_a0.m_memory.m_internal = *(deUint64 *)(p_Var3 + 8);
  local_a0.m_offset = *(VkDeviceSize *)(p_Var3 + 0x10);
  local_a0.m_hostPtr = *(void **)(p_Var3 + 0x18);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)local_80.super_VkBufferCreateInfo.pNext,local_a0.m_offset,
             uVar5);
  ::vk::Allocation::~Allocation(&local_a0);
  ::vk::Allocation::~Allocation((Allocation *)&local_80);
  SVar6.m_state = extraout_RDX;
  SVar6.m_ptr = (Buffer *)this;
  return SVar6;
}

Assistant:

de::SharedPtr<Buffer> GraphicBasicTestInstance::creatAndFillVertexBuffer (void)
{
	const DeviceInterface&		vk				= m_context.getDeviceInterface();
	const VkDevice				device			= m_context.getDevice();

	const VkDeviceSize			dataSize		= static_cast<VkDeviceSize>(deAlignSize(static_cast<size_t>( m_data.size() * sizeof(VertexData)),
		static_cast<size_t>(m_context.getDeviceProperties().limits.nonCoherentAtomSize)));

	de::SharedPtr<Buffer>		vertexBuffer	= Buffer::createAndAlloc(vk, device, BufferCreateInfo(dataSize,
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), m_context.getDefaultAllocator(), MemoryRequirement::HostVisible);

	deUint8*					ptr				= reinterpret_cast<deUint8*>(vertexBuffer->getBoundMemory().getHostPtr());
	deMemcpy(ptr, &m_data[0], static_cast<size_t>( m_data.size() * sizeof(VertexData)));

	flushMappedMemoryRange(vk, device, vertexBuffer->getBoundMemory().getMemory(), vertexBuffer->getBoundMemory().getOffset(), dataSize);
	return vertexBuffer;
}